

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall
QL_Manager::RunUpdate
          (QL_Manager *this,QL_Node *topNode,RelAttr *updAttr,int bIsValue,RelAttr *rhsRelAttr,
          Value *rhsValue)

{
  AttrCatEntry *pAVar1;
  bool bVar2;
  RelAttr *pRVar3;
  QL_Node *pQVar4;
  int iVar5;
  int extraout_EAX;
  uint uVar6;
  int extraout_EAX_00;
  int iVar7;
  int extraout_EAX_01;
  int extraout_EAX_02;
  DataAttrInfo *attributes;
  size_t sVar8;
  long lVar9;
  Value *pVVar10;
  Value *pVVar11;
  char *__src;
  char *__dest;
  IX_IndexHandle ih;
  char *pData;
  RID rid;
  int attrListSize;
  int index2;
  int index1;
  RM_Record rec;
  int finalTupLength;
  Printer printer;
  int *attrList;
  RM_FileHandle relFH;
  IX_Manager local_109;
  char *local_108;
  int local_100;
  RID local_fc;
  int local_f4;
  RelAttr *local_f0;
  int local_e8;
  int local_e4;
  char *local_e0;
  RM_Record local_d8;
  DataAttrInfo *local_c0;
  QL_Node *local_b8;
  int local_ac;
  Printer local_a8;
  int *local_80;
  RM_FileHandle local_78;
  
  QL_Node::GetTupleLength(topNode,&local_ac);
  iVar5 = QL_Node::GetAttrList(topNode,&local_80,&local_f4);
  if (iVar5 == 0) {
    local_100 = bIsValue;
    local_f0 = updAttr;
    attributes = (DataAttrInfo *)malloc((long)local_f4 * 0x44);
    iVar5 = SetUpPrinter(this,topNode,attributes);
    if (iVar5 == 0) {
      local_c0 = attributes;
      local_b8 = topNode;
      Printer::Printer(&local_a8,attributes,local_f4);
      Printer::PrintHeader(&local_a8,(ostream *)&std::cout);
      RM_FileHandle::RM_FileHandle(&local_78);
      iVar5 = RM_Manager::OpenFile(this->rmm,this->relEntries->relName,&local_78);
      if (((iVar5 == 0) && (iVar5 = GetAttrCatEntryPos(this,*local_f0,&local_e4), iVar5 == 0)) &&
         ((local_100 != 0 || (iVar5 = GetAttrCatEntryPos(this,*rhsRelAttr,&local_e8), iVar5 == 0))))
      {
        IX_Manager::DestroyIndex(&local_109);
        pQVar4 = local_b8;
        lVar9 = (long)local_e4;
        if (((this->attrEntries[lVar9].indexNo == -1) ||
            (IX_Manager::DestroyIndex(this->ixm), iVar5 = extraout_EAX, extraout_EAX == 0)) &&
           (iVar5 = (**pQVar4->_vptr_QL_Node)(pQVar4), iVar5 == 0)) {
          RM_Record::RM_Record(&local_d8);
          RID::RID(&local_fc);
          local_f0 = (RelAttr *)((long)local_e8 * 0x54);
          pVVar11 = rhsValue;
          do {
            iVar5 = (*pQVar4->_vptr_QL_Node[2])(pQVar4,&local_d8);
            if (iVar5 != 0) {
              if (((iVar5 == 0x199) && (iVar5 = (*pQVar4->_vptr_QL_Node[3])(pQVar4), iVar5 == 0)) &&
                 (((this->attrEntries[lVar9].indexNo == -1 ||
                   (IX_Manager::DestroyIndex(this->ixm), iVar5 = extraout_EAX_02,
                   extraout_EAX_02 == 0)) &&
                  (iVar5 = RM_Manager::CloseFile(this->rmm,&local_78), iVar5 == 0)))) {
                Printer::PrintFooter(&local_a8,(ostream *)&std::cout);
                free(local_c0);
                iVar5 = 0;
              }
              break;
            }
            uVar6 = RM_Record::GetRid(&local_d8,&local_fc);
            pVVar10 = (Value *)(ulong)uVar6;
            if (uVar6 == 0) {
              uVar6 = RM_Record::GetData(&local_d8,&local_108);
              pVVar10 = (Value *)(ulong)uVar6;
              if (uVar6 != 0) goto LAB_001118a7;
              if (this->attrEntries[lVar9].indexNo == -1) {
LAB_001118e9:
                pRVar3 = local_f0;
                pAVar1 = this->attrEntries;
                if (local_100 == 0) {
                  iVar5 = *(int *)((long)&pAVar1->attrLength + (long)local_f0);
                  sVar8 = (size_t)pAVar1[lVar9].attrLength;
                  __dest = local_108 + pAVar1[lVar9].offset;
                  __src = local_108 + *(int *)((long)&pAVar1->offset + (long)local_f0);
                  if (pAVar1[lVar9].attrLength <= iVar5) goto LAB_00111990;
                  memcpy(__dest,__src,(long)iVar5);
                  local_108[(long)*(int *)((long)&this->attrEntries->attrLength + (long)pRVar3) +
                            (long)this->attrEntries[lVar9].offset] = '\0';
                }
                else {
                  if (pAVar1[lVar9].attrType == STRING) {
                    local_e0 = (char *)rhsValue->data;
                    sVar8 = strlen(local_e0);
                    iVar7 = (int)sVar8 + 1;
                    __dest = local_108 + pAVar1[lVar9].offset;
                    iVar5 = pAVar1[lVar9].attrLength;
                    if (iVar7 < pAVar1[lVar9].attrLength) {
                      iVar5 = iVar7;
                    }
                    sVar8 = (size_t)iVar5;
                    __src = local_e0;
                  }
                  else {
                    __dest = local_108 + pAVar1[lVar9].offset;
                    __src = (char *)rhsValue->data;
                    sVar8 = (size_t)pAVar1[lVar9].attrLength;
                  }
LAB_00111990:
                  memcpy(__dest,__src,sVar8);
                }
                uVar6 = RM_FileHandle::UpdateRec(&local_78,&local_d8);
                pVVar10 = (Value *)(ulong)uVar6;
                if (uVar6 != 0) goto LAB_001118a7;
                Printer::Print(&local_a8,(ostream *)&std::cout,local_108);
                if (this->attrEntries[lVar9].indexNo != -1) {
                  IX_IndexHandle::DeleteEntry((IX_IndexHandle *)&local_109);
                  bVar2 = false;
                  pVVar10 = (Value *)0x0;
                  if (extraout_EAX_01 != 0) goto LAB_001118a9;
                }
                bVar2 = true;
                pVVar10 = (Value *)((ulong)pVVar11 & 0xffffffff);
              }
              else {
                IX_IndexHandle::DeleteEntry((IX_IndexHandle *)&local_109);
                bVar2 = false;
                pVVar10 = (Value *)0x0;
                if (extraout_EAX_00 == 0) goto LAB_001118e9;
              }
            }
            else {
LAB_001118a7:
              bVar2 = false;
            }
LAB_001118a9:
            iVar5 = (int)pVVar10;
            pVVar11 = pVVar10;
          } while (bVar2);
          RID::~RID(&local_fc);
          RM_Record::~RM_Record(&local_d8);
        }
        IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&local_109);
      }
      RM_FileHandle::~RM_FileHandle(&local_78);
      Printer::~Printer(&local_a8);
    }
  }
  return iVar5;
}

Assistant:

RC QL_Manager::RunUpdate(QL_Node *topNode, const RelAttr &updAttr,
                      const int bIsValue,
                      const RelAttr &rhsRelAttr,
                      const Value &rhsValue){
  RC rc = 0;
  // Retrieves the attributes in this relation for the printer setup
  int finalTupLength, attrListSize;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, attributes)))
    return (rc);
  Printer printer(attributes, attrListSize);
  printer.PrintHeader(cout);


  // Open the file
  RM_FileHandle relFH;
  if((rc = rmm.OpenFile(relEntries->relName, relFH)))
    return (rc);

  int index1, index2; // Get the attrEntries indices to the RHS and LHS attributes
  if((rc = GetAttrCatEntryPos(updAttr, index1)))
    return (rc);
  if(!bIsValue){
    if((rc = GetAttrCatEntryPos(rhsRelAttr, index2)))
      return (rc);
  }

  // Get the index to the attribute to be update, if there is one
  IX_IndexHandle ih;
  if((attrEntries[index1].indexNo != -1)){
    if((rc = ixm.OpenIndex(relEntries->relName, attrEntries[index1].indexNo, ih)))
      return (rc);
  }

  // Find all tuples that meet the condition
  if((rc = topNode->OpenIt() ))
    return (rc);
  RM_Record rec;
  RID rid;
  while(true){
    if((rc = topNode->GetNextRec(rec))){
      if (rc == QL_EOI){
        break;
      }
      return (rc);
    }
    char *pData;
    if((rc = rec.GetRid(rid)) || (rc = rec.GetData(pData)) )
      return (rc);
    if(attrEntries[index1].indexNo != -1){ // Delete this value from the index
      if((ih.DeleteEntry(pData + attrEntries[index1].offset, rid)))
        return (rc);
    }
    
    // Set the attribute to its new value
    if(bIsValue){
      if(attrEntries[index1].attrType == STRING){
        int valueLength = strlen((char *)rhsValue.data);
        if(attrEntries[index1].attrLength <= (valueLength + 1) )
          memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, attrEntries[index1].attrLength);
        else
          memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, valueLength + 1);
      }
      else
        memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, attrEntries[index1].attrLength);
    }
    else{
      if(attrEntries[index2].attrLength >= attrEntries[index1].attrLength)
        memcpy(pData + attrEntries[index1].offset, pData + attrEntries[index2].offset, attrEntries[index1].attrLength);
      else{
        memcpy(pData + attrEntries[index1].offset, pData + attrEntries[index2].offset, attrEntries[index2].attrLength);
        pData[attrEntries[index1].offset + attrEntries[index2].attrLength] = '\0';
      }
    }

    // Upate this record in the file
    if((rc = relFH.UpdateRec(rec)))
      return (rc);
    printer.Print(cout, pData);
    
    // Update the record in the index
    if(attrEntries[index1].indexNo != -1){
      if((ih.InsertEntry(pData + attrEntries[index1].offset, rid)))
        return (rc);
    }

  }
  if((rc = topNode->CloseIt()))
    return (rc);
    
  if((attrEntries[index1].indexNo != -1)){ // Close file and indices
    if((rc = ixm.CloseIndex(ih)))
      return (rc);
  }
  if((rc = rmm.CloseFile(relFH)))
    return (rc);

  printer.PrintFooter(cout);
  free(attributes);

  return (0);
}